

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O2

wchar_t project_player_handler_COLD(project_player_handler_context_t *context)

{
  player_state_conflict state;
  _Bool _Var1;
  uint32_t uVar2;
  long lVar3;
  wchar_t wVar4;
  player_state_conflict *ppVar5;
  undefined1 *puVar6;
  source sVar7;
  source origin;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 in_stack_fffffffffffffea8 [280];
  undefined4 uVar26;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  ppVar5 = &player->state;
  puVar6 = &stack0xfffffffffffffea8;
  for (lVar3 = 0x13c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = (char)ppVar5->stat_add[0];
    ppVar5 = (player_state_conflict *)((long)ppVar5->stat_add + 1);
    puVar6 = puVar6 + 1;
  }
  uVar26 = (undefined4)((ulong)in_stack_ffffffffffffffc0 >> 0x10);
  state.el_info[0x13].flags = (char)in_stack_ffffffffffffffc0;
  state.el_info[0x13]._3_1_ = (char)((ulong)in_stack_ffffffffffffffc0 >> 8);
  state.el_info[0x14].res_level = (short)uVar26;
  state.el_info[0x14].flags = (char)((uint)uVar26 >> 0x10);
  state.el_info[0x14]._3_1_ = (char)((uint)uVar26 >> 0x18);
  state.el_info[0x15].res_level = (short)((ulong)in_stack_ffffffffffffffc0 >> 0x30);
  uVar26 = in_stack_fffffffffffffea8._202_4_;
  uVar8 = in_stack_fffffffffffffea8._206_4_;
  uVar9 = in_stack_fffffffffffffea8._210_4_;
  uVar10 = in_stack_fffffffffffffea8._214_4_;
  uVar11 = in_stack_fffffffffffffea8._218_4_;
  uVar12 = in_stack_fffffffffffffea8._222_4_;
  uVar13 = in_stack_fffffffffffffea8._226_4_;
  uVar14 = in_stack_fffffffffffffea8._230_4_;
  uVar15 = in_stack_fffffffffffffea8._234_4_;
  uVar16 = in_stack_fffffffffffffea8._238_4_;
  uVar17 = in_stack_fffffffffffffea8._242_4_;
  uVar18 = in_stack_fffffffffffffea8._246_4_;
  uVar19 = in_stack_fffffffffffffea8._250_4_;
  uVar20 = in_stack_fffffffffffffea8._254_4_;
  uVar21 = in_stack_fffffffffffffea8._258_4_;
  uVar22 = in_stack_fffffffffffffea8._262_4_;
  uVar23 = in_stack_fffffffffffffea8._266_4_;
  uVar24 = in_stack_fffffffffffffea8._270_4_;
  uVar25 = in_stack_fffffffffffffea8._274_4_;
  state.stat_add[0] = in_stack_fffffffffffffea8._0_4_;
  state.stat_add[1] = in_stack_fffffffffffffea8._4_4_;
  state.stat_add[2] = in_stack_fffffffffffffea8._8_4_;
  state.stat_add[3] = in_stack_fffffffffffffea8._12_4_;
  state.stat_add[4] = in_stack_fffffffffffffea8._16_4_;
  state.stat_ind[0] = in_stack_fffffffffffffea8._20_4_;
  state.stat_ind[1] = in_stack_fffffffffffffea8._24_4_;
  state.stat_ind[2] = in_stack_fffffffffffffea8._28_4_;
  state.stat_ind[3] = in_stack_fffffffffffffea8._32_4_;
  state.stat_ind[4] = in_stack_fffffffffffffea8._36_4_;
  state.stat_use[0] = in_stack_fffffffffffffea8._40_4_;
  state.stat_use[1] = in_stack_fffffffffffffea8._44_4_;
  state.stat_use[2] = in_stack_fffffffffffffea8._48_4_;
  state.stat_use[3] = in_stack_fffffffffffffea8._52_4_;
  state.stat_use[4] = in_stack_fffffffffffffea8._56_4_;
  state.stat_top[0] = in_stack_fffffffffffffea8._60_4_;
  state.stat_top[1] = in_stack_fffffffffffffea8._64_4_;
  state.stat_top[2] = in_stack_fffffffffffffea8._68_4_;
  state.stat_top[3] = in_stack_fffffffffffffea8._72_4_;
  state.stat_top[4] = in_stack_fffffffffffffea8._76_4_;
  state.skills[0] = in_stack_fffffffffffffea8._80_4_;
  state.skills[1] = in_stack_fffffffffffffea8._84_4_;
  state.skills[2] = in_stack_fffffffffffffea8._88_4_;
  state.skills[3] = in_stack_fffffffffffffea8._92_4_;
  state.skills[4] = in_stack_fffffffffffffea8._96_4_;
  state.skills[5] = in_stack_fffffffffffffea8._100_4_;
  state.skills[6] = in_stack_fffffffffffffea8._104_4_;
  state.skills[7] = in_stack_fffffffffffffea8._108_4_;
  state.skills[8] = in_stack_fffffffffffffea8._112_4_;
  state.skills[9] = in_stack_fffffffffffffea8._116_4_;
  state.speed = in_stack_fffffffffffffea8._120_4_;
  state.num_blows = in_stack_fffffffffffffea8._124_4_;
  state.num_shots = in_stack_fffffffffffffea8._128_4_;
  state.num_moves = in_stack_fffffffffffffea8._132_4_;
  state.ammo_mult = in_stack_fffffffffffffea8._136_4_;
  state.ammo_tval = in_stack_fffffffffffffea8._140_4_;
  state.ac = in_stack_fffffffffffffea8._144_4_;
  state.dam_red = in_stack_fffffffffffffea8._148_4_;
  state.perc_dam_red = in_stack_fffffffffffffea8._152_4_;
  state.to_a = in_stack_fffffffffffffea8._156_4_;
  state.to_h = in_stack_fffffffffffffea8._160_4_;
  state.to_d = in_stack_fffffffffffffea8._164_4_;
  state.see_infra = in_stack_fffffffffffffea8._168_4_;
  state.cur_light = in_stack_fffffffffffffea8._172_4_;
  state.evasion_chance = in_stack_fffffffffffffea8._176_4_;
  state.shield_on_back = (_Bool)in_stack_fffffffffffffea8[0xb4];
  state.heavy_wield = (_Bool)in_stack_fffffffffffffea8[0xb5];
  state.heavy_shoot = (_Bool)in_stack_fffffffffffffea8[0xb6];
  state.bless_wield = (_Bool)in_stack_fffffffffffffea8[0xb7];
  state.cumber_armor = (_Bool)in_stack_fffffffffffffea8[0xb8];
  state.flags[0] = in_stack_fffffffffffffea8[0xb9];
  state.flags[1] = in_stack_fffffffffffffea8[0xba];
  state.flags[2] = in_stack_fffffffffffffea8[0xbb];
  state.flags[3] = in_stack_fffffffffffffea8[0xbc];
  state.flags[4] = in_stack_fffffffffffffea8[0xbd];
  state.flags[5] = in_stack_fffffffffffffea8[0xbe];
  state.pflags[0] = in_stack_fffffffffffffea8[0xbf];
  state.pflags[1] = in_stack_fffffffffffffea8[0xc0];
  state.pflags[2] = in_stack_fffffffffffffea8[0xc1];
  state.pflags[3] = in_stack_fffffffffffffea8[0xc2];
  state.pflags[4] = in_stack_fffffffffffffea8[0xc3];
  state.pflags[5] = in_stack_fffffffffffffea8[0xc4];
  state.pflags[6] = in_stack_fffffffffffffea8[0xc5];
  state.pflags[7] = in_stack_fffffffffffffea8[0xc6];
  state.pflags[8] = in_stack_fffffffffffffea8[199];
  state.pflags[9] = in_stack_fffffffffffffea8[200];
  state._201_1_ = in_stack_fffffffffffffea8[0xc9];
  state.el_info[0].res_level = (short)uVar26;
  state.el_info[0].flags = (char)((uint)uVar26 >> 0x10);
  state.el_info[0]._3_1_ = (char)((uint)uVar26 >> 0x18);
  state.el_info[1].res_level = (short)uVar8;
  state.el_info[1].flags = (char)((uint)uVar8 >> 0x10);
  state.el_info[1]._3_1_ = (char)((uint)uVar8 >> 0x18);
  state.el_info[2].res_level = (short)uVar9;
  state.el_info[2].flags = (char)((uint)uVar9 >> 0x10);
  state.el_info[2]._3_1_ = (char)((uint)uVar9 >> 0x18);
  state.el_info[3].res_level = (short)uVar10;
  state.el_info[3].flags = (char)((uint)uVar10 >> 0x10);
  state.el_info[3]._3_1_ = (char)((uint)uVar10 >> 0x18);
  state.el_info[4].res_level = (short)uVar11;
  state.el_info[4].flags = (char)((uint)uVar11 >> 0x10);
  state.el_info[4]._3_1_ = (char)((uint)uVar11 >> 0x18);
  state.el_info[5].res_level = (short)uVar12;
  state.el_info[5].flags = (char)((uint)uVar12 >> 0x10);
  state.el_info[5]._3_1_ = (char)((uint)uVar12 >> 0x18);
  state.el_info[6].res_level = (short)uVar13;
  state.el_info[6].flags = (char)((uint)uVar13 >> 0x10);
  state.el_info[6]._3_1_ = (char)((uint)uVar13 >> 0x18);
  state.el_info[7].res_level = (short)uVar14;
  state.el_info[7].flags = (char)((uint)uVar14 >> 0x10);
  state.el_info[7]._3_1_ = (char)((uint)uVar14 >> 0x18);
  state.el_info[8].res_level = (short)uVar15;
  state.el_info[8].flags = (char)((uint)uVar15 >> 0x10);
  state.el_info[8]._3_1_ = (char)((uint)uVar15 >> 0x18);
  state.el_info[9].res_level = (short)uVar16;
  state.el_info[9].flags = (char)((uint)uVar16 >> 0x10);
  state.el_info[9]._3_1_ = (char)((uint)uVar16 >> 0x18);
  state.el_info[10].res_level = (short)uVar17;
  state.el_info[10].flags = (char)((uint)uVar17 >> 0x10);
  state.el_info[10]._3_1_ = (char)((uint)uVar17 >> 0x18);
  state.el_info[0xb].res_level = (short)uVar18;
  state.el_info[0xb].flags = (char)((uint)uVar18 >> 0x10);
  state.el_info[0xb]._3_1_ = (char)((uint)uVar18 >> 0x18);
  state.el_info[0xc].res_level = (short)uVar19;
  state.el_info[0xc].flags = (char)((uint)uVar19 >> 0x10);
  state.el_info[0xc]._3_1_ = (char)((uint)uVar19 >> 0x18);
  state.el_info[0xd].res_level = (short)uVar20;
  state.el_info[0xd].flags = (char)((uint)uVar20 >> 0x10);
  state.el_info[0xd]._3_1_ = (char)((uint)uVar20 >> 0x18);
  state.el_info[0xe].res_level = (short)uVar21;
  state.el_info[0xe].flags = (char)((uint)uVar21 >> 0x10);
  state.el_info[0xe]._3_1_ = (char)((uint)uVar21 >> 0x18);
  state.el_info[0xf].res_level = (short)uVar22;
  state.el_info[0xf].flags = (char)((uint)uVar22 >> 0x10);
  state.el_info[0xf]._3_1_ = (char)((uint)uVar22 >> 0x18);
  state.el_info[0x10].res_level = (short)uVar23;
  state.el_info[0x10].flags = (char)((uint)uVar23 >> 0x10);
  state.el_info[0x10]._3_1_ = (char)((uint)uVar23 >> 0x18);
  state.el_info[0x11].res_level = (short)uVar24;
  state.el_info[0x11].flags = (char)((uint)uVar24 >> 0x10);
  state.el_info[0x11]._3_1_ = (char)((uint)uVar24 >> 0x18);
  state.el_info[0x12].res_level = (short)uVar25;
  state.el_info[0x12].flags = (char)((uint)uVar25 >> 0x10);
  state.el_info[0x12]._3_1_ = (char)((uint)uVar25 >> 0x18);
  state.el_info[0x13].res_level = in_stack_fffffffffffffea8._278_2_;
  state.el_info[0x15].flags = (char)in_stack_ffffffffffffffc8;
  state.el_info[0x15]._3_1_ = (char)((uint)in_stack_ffffffffffffffc8 >> 8);
  state.el_info[0x16].res_level = (short)((uint)in_stack_ffffffffffffffc8 >> 0x10);
  state.el_info[0x16].flags = (char)in_stack_ffffffffffffffcc;
  state.el_info[0x16]._3_1_ = (char)((uint)in_stack_ffffffffffffffcc >> 8);
  state.el_info[0x17].res_level = (short)((uint)in_stack_ffffffffffffffcc >> 0x10);
  state.el_info[0x17].flags = (char)in_stack_ffffffffffffffd0;
  state.el_info[0x17]._3_1_ = (char)((uint)in_stack_ffffffffffffffd0 >> 8);
  state.el_info[0x18].res_level = (short)((uint)in_stack_ffffffffffffffd0 >> 0x10);
  state.el_info[0x18].flags = (char)in_stack_ffffffffffffffd4;
  state.el_info[0x18]._3_1_ = (char)((uint)in_stack_ffffffffffffffd4 >> 8);
  state.el_info[0x19].res_level = (short)((uint)in_stack_ffffffffffffffd4 >> 0x10);
  state.el_info[0x19].flags = (char)in_stack_ffffffffffffffd8;
  state.el_info[0x19]._3_1_ = (char)((uint)in_stack_ffffffffffffffd8 >> 8);
  state.el_info[0x1a].res_level = (short)((uint)in_stack_ffffffffffffffd8 >> 0x10);
  state.el_info[0x1a].flags = (char)in_stack_ffffffffffffffdc;
  state.el_info[0x1a]._3_1_ = (char)((uint)in_stack_ffffffffffffffdc >> 8);
  state.el_info[0x1b].res_level = (short)((uint)in_stack_ffffffffffffffdc >> 0x10);
  state.el_info[0x1b].flags = (char)in_stack_ffffffffffffffe0;
  state.el_info[0x1b]._3_1_ = (char)((uint)in_stack_ffffffffffffffe0 >> 8);
  state._314_2_ = (short)((uint)in_stack_ffffffffffffffe0 >> 0x10);
  _Var1 = player_is_immune(state,L'\x03');
  if (!_Var1) {
    wVar4 = L'Ĭ';
    if (context->dam < L'=') {
      wVar4 = context->dam * 5;
    }
    inven_damage(player,L'\x03',wVar4);
    if (L'O' < context->power) {
      uVar2 = Rand_div(context->dam);
      if (500 < (int)uVar2) {
        msg("The cold seeps into your bones.");
        sVar7 = source_none();
        origin.which = sVar7.which;
        origin._4_4_ = 0;
        origin.what = sVar7.what;
        effect_simple(L'\x11',origin,"0",L'\x03',L'\0',L'\0',L'\0',L'\0',&context->obvious);
      }
      uVar2 = Rand_div(context->dam);
      if (500 < (int)uVar2) {
        _Var1 = player_of_has(player,L'\x10');
        if (_Var1) {
          equip_learn_flag(player,L'\x10');
        }
        else {
          wVar4 = context->dam;
          msg("The cold withers your life force!");
          player_exp_lose(player,wVar4,false);
        }
      }
    }
  }
  return L'\0';
}

Assistant:

static int project_player_handler_COLD(project_player_handler_context_t *context)
{
	if (player_is_immune(player->state, ELEM_COLD)) return 0;
	inven_damage(player, PROJ_COLD, MIN(context->dam * 5, 300));

	/* Occasional side-effects for powerful cold attacks */
	if (context->power >= 80) {
		if (randint0(context->dam) > 500) {
			msg("The cold seeps into your bones.");
			effect_simple(EF_DRAIN_STAT, source_none(), "0", STAT_DEX, 0, 0, 0,
						  0, &context->obvious);
		}
		if (randint0(context->dam) > 500) {
			if (player_of_has(player, OF_HOLD_LIFE)) {
				equip_learn_flag(player, OF_HOLD_LIFE);
			} else {
				int drain = context->dam;
				msg("The cold withers your life force!");
				player_exp_lose(player, drain, false);
			}
		}
	}
	return 0;
}